

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

void proxy_worker_func(worker_handle *wh)

{
  mutex_handle *mutex;
  long *data;
  mutex_handle *pmVar1;
  long *plVar2;
  long lVar3;
  proxy_handle *ppVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  size_t data_len;
  proxy_conn_handle *pc;
  proxy_conn_handle **pppVar8;
  char *pcVar9;
  proxy_conn_handle ***ppppVar10;
  int iVar11;
  size_t buff_len;
  undefined1 *buff_00;
  proxy_conn_handle *ppVar12;
  uint8_t *buff_01;
  ulong uVar13;
  uint32_t nonce;
  char nonce_str [9];
  uint8_t buff [28];
  char remote_addr [54];
  uint32_t local_bc;
  ulong local_b8;
  undefined8 local_b0;
  uint8_t local_a8 [23];
  uint8_t local_91 [9];
  uint8_t local_88 [16];
  uint8_t local_78 [16];
  char local_68 [56];
  
  plVar2 = (long *)wh->func_ctx;
  lVar3 = *(long *)*plVar2;
  mutex = (mutex_handle *)(plVar2 + 3);
  mutex_lock_shared(mutex);
  if (plVar2[1] == 0) {
    proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_ERROR,
              "New connection was signaled, but no connection was given\n");
    mutex_unlock_shared(mutex);
    return;
  }
  mutex_unlock_shared(mutex);
  conn_get_remote_addr((conn_handle *)plVar2[1],local_68);
  proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_DEBUG,
            "New connection - beginning authorization procedure\n");
  iVar6 = rand_get(&local_bc);
  if (-1 < iVar6) {
    digest_to_hex32(local_bc,(char *)local_91);
    get_password_response(local_bc,*(char **)(*plVar2 + 0x30),local_a8);
    iVar6 = conn_send((conn_handle *)plVar2[1],local_91,8);
    if (-1 < iVar6) {
      buff_01 = local_88;
      iVar6 = conn_recv((conn_handle *)plVar2[1],buff_01,0x10);
      if (-1 < iVar6) {
        buff_len = 1;
        do {
          if (*buff_01 == '\n') {
            *buff_01 = '\0';
            data = plVar2 + 8;
            strcpy((char *)data,(char *)local_88);
            iVar6 = conn_recv((conn_handle *)plVar2[1],local_78,buff_len);
            if (iVar6 < 0) goto LAB_001052cc;
            lVar7 = 1;
            buff_00 = proxy_worker_authorize_msg_bad_pw;
            pcVar9 = "Client \'%s\' supplied an incorrect password. Dropping...\n";
            goto LAB_0010537b;
          }
          buff_01 = buff_01 + 1;
          buff_len = buff_len + 1;
        } while (buff_len != 0xc);
        iVar11 = -0x16;
        goto LAB_0010558a;
      }
    }
  }
LAB_001052cc:
  iVar11 = iVar6;
  if (iVar11 < -0x20) {
    if ((iVar11 != -0x6b) && (iVar11 != -0x68)) goto LAB_0010558a;
  }
  else if ((iVar11 != -4) && (iVar11 != -0x20)) goto LAB_0010558a;
  proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_WARN,
            "Connection to client was lost before authorization could complete\n");
  goto LAB_001055b8;
  while (lVar7 = lVar7 + 1, lVar7 != 0x11) {
LAB_0010537b:
    if (local_a8[lVar7 + -1] != buff_01[lVar7]) goto LAB_00105555;
  }
  iVar6 = proxy_authorize_callsign((proxy_handle *)*plVar2,(char *)data);
  if (iVar6 != 0) {
    proxy_update_registration((proxy_handle *)*plVar2);
    data_len = strlen((char *)data);
    bVar5 = pearson_get((uint8_t *)data,data_len);
    uVar13 = (ulong)bVar5;
    proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_DEBUG,"Searching callsign bucket %u\n");
    pmVar1 = (mutex_handle *)(lVar3 + 0x878);
    mutex_lock(pmVar1);
    pc = *(proxy_conn_handle **)(lVar3 + 8);
    if (pc == (proxy_conn_handle *)0x0) {
      mutex_unlock(pmVar1);
      proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_ERROR,"Idle slot pool is empty.\n");
    }
    else {
      ppVar12 = *(proxy_conn_handle **)(lVar3 + 0x18 + uVar13 * 8);
      local_b8 = uVar13;
      local_b0 = pmVar1;
      if (ppVar12 != (proxy_conn_handle *)0x0) {
        do {
          iVar6 = proxy_conn_accept(ppVar12,(conn_handle *)plVar2[1],(char *)data,'\x01');
          pc = ppVar12;
          if (iVar6 != -0x10) goto LAB_00105455;
          ppVar12 = ppVar12->next_by_call;
        } while (ppVar12 != (proxy_conn_handle *)0x0);
        pc = *(proxy_conn_handle **)(lVar3 + 8);
      }
      iVar6 = proxy_conn_accept(pc,(conn_handle *)plVar2[1],(char *)data,'\0');
LAB_00105455:
      pmVar1 = local_b0;
      if (iVar6 < 0) {
        mutex_unlock(local_b0);
        ppVar4 = (proxy_handle *)*plVar2;
        pcVar9 = strerror(-iVar6);
        proxy_log(ppVar4,LOG_LEVEL_ERROR,"Failed to acquire slot (%d): %s\n",(ulong)(uint)-iVar6,
                  pcVar9);
      }
      else {
        pppVar8 = (proxy_conn_handle **)(lVar3 + local_b8 * 8 + 0x18);
        ppVar12 = pc->next;
        *pc->prev_ptr = ppVar12;
        ppppVar10 = &ppVar12->prev_ptr;
        if (ppVar12 == (proxy_conn_handle *)0x0) {
          ppppVar10 = (proxy_conn_handle ***)(lVar3 + 0x10);
        }
        *ppppVar10 = pc->prev_ptr;
        if (pc->prev_by_call_ptr != (proxy_conn_handle **)0x0) {
          ppVar12 = pc->next_by_call;
          *pc->prev_by_call_ptr = ppVar12;
          if (ppVar12 != (proxy_conn_handle *)0x0) {
            ppVar12->prev_by_call_ptr = pc->prev_by_call_ptr;
          }
        }
        pc->prev_by_call_ptr = pppVar8;
        ppVar12 = *pppVar8;
        pc->next_by_call = ppVar12;
        if (ppVar12 != (proxy_conn_handle *)0x0) {
          ppVar12->prev_by_call_ptr = &pc->next_by_call;
        }
        *pppVar8 = pc;
        mutex_unlock(local_b0);
        do {
          iVar6 = proxy_conn_process(pc);
        } while (-1 < iVar6);
        proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_INFO,"Disconnected from client \'%s\'.\n",data);
        proxy_conn_finish(pc);
        pc->next = (proxy_conn_handle *)0x0;
        mutex_lock(pmVar1);
        pppVar8 = *(proxy_conn_handle ***)(lVar3 + 0x10);
        pc->prev_ptr = pppVar8;
        *pppVar8 = pc;
        *(proxy_conn_handle ***)(lVar3 + 0x10) = &pc->next;
        mutex_unlock(pmVar1);
      }
    }
    mutex_lock(mutex);
    conn_free((conn_handle *)plVar2[1]);
    free((void *)plVar2[1]);
    plVar2[1] = 0;
    mutex_unlock(mutex);
    mutex_lock((mutex_handle *)(lVar3 + 0x880));
    plVar2[2] = *(long *)(lVar3 + 0x820);
    *(long **)(lVar3 + 0x820) = plVar2;
    mutex_unlock((mutex_handle *)(lVar3 + 0x880));
    proxy_update_registration((proxy_handle *)*plVar2);
    proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_DEBUG,"Client worker is returning cleanly.\n");
    return;
  }
  buff_00 = proxy_worker_authorize_msg_bad_auth;
  pcVar9 = "Client \'%s\' is not authorized to use this proxy. Dropping...\n";
LAB_00105555:
  proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_INFO,pcVar9,data);
  iVar6 = conn_send((conn_handle *)plVar2[1],buff_00,10);
  iVar11 = -0xd;
  if (iVar6 < 0) goto LAB_001052cc;
LAB_0010558a:
  ppVar4 = (proxy_handle *)*plVar2;
  pcVar9 = strerror(-iVar11);
  proxy_log(ppVar4,LOG_LEVEL_ERROR,"Authorization failed for client \'%s\' (%d): %s\n",local_68,
            (ulong)(uint)-iVar11,pcVar9);
LAB_001055b8:
  mutex_lock(mutex);
  conn_free((conn_handle *)plVar2[1]);
  free((void *)plVar2[1]);
  plVar2[1] = 0;
  mutex_unlock(mutex);
  mutex_lock((mutex_handle *)(lVar3 + 0x880));
  plVar2[2] = *(long *)(lVar3 + 0x820);
  *(long **)(lVar3 + 0x820) = plVar2;
  mutex_unlock((mutex_handle *)(lVar3 + 0x880));
  return;
}

Assistant:

static void proxy_worker_func(struct worker_handle *wh)
{
	struct proxy_worker *pw = wh->func_ctx;
	struct proxy_priv *priv = pw->ph->priv;
	struct proxy_conn_handle *pc = NULL;
	int ret;
	char remote_addr[54];
	uint8_t hash;

	mutex_lock_shared(&pw->mutex);

	if (pw->conn_client == NULL) {
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "New connection was signaled, but no connection was given\n");

		mutex_unlock_shared(&pw->mutex);

		return;
	}

	mutex_unlock_shared(&pw->mutex);

	conn_get_remote_addr(pw->conn_client, remote_addr);

	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "New connection - beginning authorization procedure\n");

	ret = proxy_worker_authorize(pw);
	if (ret < 0) {
		switch (ret) {
		case -ECONNRESET:
		case -EINTR:
		case -ENOTCONN:
		case -EPIPE:
			proxy_log(pw->ph, LOG_LEVEL_WARN,
				  "Connection to client was lost before authorization could complete\n");
			break;
		default:
			proxy_log(pw->ph, LOG_LEVEL_ERROR,
				  "Authorization failed for client '%s' (%d): %s\n",
				  remote_addr, -ret, strerror(-ret));
		}

		mutex_lock(&pw->mutex);
		conn_free(pw->conn_client);
		free(pw->conn_client);
		pw->conn_client = NULL;
		mutex_unlock(&pw->mutex);

		mutex_lock(&priv->idle_workers_mutex);
		pw->next = priv->idle_workers_head;
		priv->idle_workers_head = pw;
		mutex_unlock(&priv->idle_workers_mutex);

		return;
	}

	proxy_update_registration(pw->ph);

	hash = pearson_get((uint8_t *)pw->callsign, strlen(pw->callsign));
	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "Searching callsign bucket %u\n", hash);

	mutex_lock(&priv->idle_clients_mutex);
	if (priv->idle_clients_head == NULL) {
		mutex_unlock(&priv->idle_clients_mutex);
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "Idle slot pool is empty.\n");
		goto proxy_worker_func_exit;
	}

	pc = priv->clients_by_call[hash];
	/* First, check for a reconnect */
	while (pc != NULL) {
		ret = proxy_conn_accept(pc, pw->conn_client, pw->callsign, 1);
		if (ret != -EBUSY)
			break;
		pc = pc->next_by_call;
	}
	/* Fall back on the oldest available slot */
	if (pc == NULL) {
		pc = priv->idle_clients_head;
		ret = proxy_conn_accept(pc, pw->conn_client, pw->callsign, 0);
	}
	if (ret < 0) {
		mutex_unlock(&priv->idle_clients_mutex);
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "Failed to acquire slot (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_worker_func_exit;
	}

	/* Remove the slot from the pool */
	*pc->prev_ptr = pc->next;
	if (pc->next == NULL)
		priv->idle_clients_tail_ptr = pc->prev_ptr;
	else
		pc->next->prev_ptr = pc->prev_ptr;

	/* Remove the slot from the hash map */
	if (pc->prev_by_call_ptr != NULL) {
		*pc->prev_by_call_ptr = pc->next_by_call;
		if (pc->next_by_call)
			pc->next_by_call->prev_by_call_ptr = pc->prev_by_call_ptr;
	}

	/* Add the slot to the hash map */
	pc->prev_by_call_ptr = &priv->clients_by_call[hash];
	pc->next_by_call = priv->clients_by_call[hash];
	if (pc->next_by_call != NULL)
		pc->next_by_call->prev_by_call_ptr = &pc->next_by_call;
	priv->clients_by_call[hash] = pc;
	mutex_unlock(&priv->idle_clients_mutex);

	do {
		ret = proxy_conn_process(pc);
	} while (ret >= 0);

	proxy_log(pw->ph, LOG_LEVEL_INFO,
		  "Disconnected from client '%s'.\n", pw->callsign);

	proxy_conn_finish(pc);

	/* Put the slot back in the pool */
	pc->next = NULL;
	mutex_lock(&priv->idle_clients_mutex);
	pc->prev_ptr = priv->idle_clients_tail_ptr;
	*priv->idle_clients_tail_ptr = pc;
	priv->idle_clients_tail_ptr = &pc->next;
	mutex_unlock(&priv->idle_clients_mutex);

proxy_worker_func_exit:
	mutex_lock(&pw->mutex);
	conn_free(pw->conn_client);
	free(pw->conn_client);
	pw->conn_client = NULL;
	mutex_unlock(&pw->mutex);

	mutex_lock(&priv->idle_workers_mutex);
	pw->next = priv->idle_workers_head;
	priv->idle_workers_head = pw;
	mutex_unlock(&priv->idle_workers_mutex);

	proxy_update_registration(pw->ph);

	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "Client worker is returning cleanly.\n");
}